

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O2

void __thiscall ValidationSignals::SyncWithValidationInterfaceQueue(ValidationSignals *this)

{
  function<void_()> func;
  promise<void> *__state;
  long in_FS_OFFSET;
  promise<void> promise;
  _Function_base in_stack_ffffffffffffff98;
  promise<void> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::promise<void>::promise(&local_30);
  func._M_invoker = (_Invoker_type)&local_30;
  func.super__Function_base = in_stack_ffffffffffffff98;
  CallFunctionInValidationInterfaceQueue(this,func);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffffb0);
  __state = &local_30;
  std::__basic_future<void>::__basic_future
            ((__basic_future<void> *)&stack0xffffffffffffffa0,&__state->_M_future);
  std::__basic_future<void>::wait((__basic_future<void> *)&stack0xffffffffffffffa0,__state);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffa8);
  std::promise<void>::~promise(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ValidationSignals::SyncWithValidationInterfaceQueue()
{
    AssertLockNotHeld(cs_main);
    // Block until the validation queue drains
    std::promise<void> promise;
    CallFunctionInValidationInterfaceQueue([&promise] {
        promise.set_value();
    });
    promise.get_future().wait();
}